

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcGlyphAttrMatrix.h
# Opt level: O0

void __thiscall
GrcGlyphAttrMatrix::GrcGlyphAttrMatrix
          (GrcGlyphAttrMatrix *this,size_t cGlyphIDs,size_t cGlyphAttrs,size_t cStyles)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  ulong *local_60;
  
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RSI;
  in_RDI[3] = in_RCX;
  uVar2 = in_RSI * in_RDX * in_RCX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x48),0);
  uVar5 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x48),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar5);
  *puVar4 = uVar2;
  puVar4 = puVar4 + 1;
  if (uVar2 != 0) {
    local_60 = puVar4;
    do {
      GrcAssignment::GrcAssignment((GrcAssignment *)0x14e067);
      local_60 = local_60 + 9;
    } while (local_60 != puVar4 + uVar2 * 9);
  }
  *in_RDI = puVar4;
  return;
}

Assistant:

GrcGlyphAttrMatrix(size_t cGlyphIDs, size_t cGlyphAttrs, size_t cStyles)
	{
		m_cGlyphAttrs = cGlyphAttrs;
		m_cGlyphIDs = cGlyphIDs;
		m_cStyles = cStyles;
		m_prgasgnx = new GrcAssignment[cGlyphIDs * cGlyphAttrs * cStyles];
	}